

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadsheetMode.cpp
# Opt level: O3

void __thiscall KDReports::Test::testHorizontalScaling(Test *this)

{
  Data *pDVar1;
  qsizetype qVar2;
  char cVar3;
  int iVar4;
  AutoTableElement *pAVar5;
  reference pQVar6;
  QRect *pQVar7;
  int iVar8;
  double dVar9;
  QByteArrayView QVar10;
  QArrayDataPointer<QRect> local_98;
  QArrayDataPointer<QRect> local_78;
  Report report;
  QRect local_40;
  storage_type *local_30;
  int local_28;
  int iStack_24;
  
  fillModel(this,0x14,4,false);
  KDReports::Report::Report(&report,(QObject *)0x0);
  KDReports::Report::setReportMode((ReportMode)&report);
  pAVar5 = (AutoTableElement *)KDReports::Report::mainTable();
  KDReports::AutoTableElement::AutoTableElement
            ((AutoTableElement *)&local_78,(QAbstractItemModel *)&this->m_model);
  KDReports::MainTable::setAutoTableElement(pAVar5);
  KDReports::AutoTableElement::~AutoTableElement((AutoTableElement *)&local_78);
  KDReports::Report::scaleTo((int)&report,2);
  local_98.d = (Data *)0x0;
  local_98.ptr = (QRect *)0x0;
  local_98.size = 0;
  QByteArrayView::QByteArrayView<char,_true>((QByteArrayView *)&local_30,"Noto Sans",9);
  QVar10.m_data = local_30;
  QVar10.m_size = (qsizetype)&local_78;
  QString::fromLatin1(QVar10);
  qVar2 = local_98.size;
  pQVar7 = local_98.ptr;
  pDVar1 = local_98.d;
  local_98.d = local_78.d;
  local_98.ptr = local_78.ptr;
  local_78.d = pDVar1;
  local_78.ptr = pQVar7;
  local_98.size = local_78.size;
  local_78.size = qVar2;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
  QFont::QFont((QFont *)&local_40,(QString *)&local_98,0x30,-1,false);
  KDReports::Report::setDefaultFont((QFont *)&report);
  QFont::~QFont((QFont *)&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  iVar4 = KDReports::Report::numberOfPages();
  cVar3 = QTest::qCompare(iVar4,2,"report.numberOfPages()","2",
                          "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                          ,0xf1);
  if (cVar3 != '\0') {
    KDReports::Report::mainTable();
    dVar9 = (double)KDReports::MainTable::lastAutoFontScalingFactor();
    cVar3 = QTest::qVerify(dVar9 < 0.9,"report.mainTable()->lastAutoFontScalingFactor() < 0.9","",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                           ,0xf2);
    if (cVar3 != '\0') {
      KDReports::Report::mainTable();
      KDReports::MainTable::pageRects();
      pQVar6 = QList<QRect>::operator[]((QList<QRect> *)&local_78,0);
      iVar8 = pQVar6->x2 - pQVar6->x1;
      iVar4 = iVar8 + 1;
      QArrayDataPointer<QRect>::~QArrayDataPointer(&local_78);
      if (iVar8 - 9U < 6) {
        QString::number((int)&local_98,iVar4);
        QString::toLocal8Bit_helper((QChar *)&local_78,(longlong)local_98.ptr);
        pQVar7 = local_78.ptr;
        if (local_78.ptr == (QRect *)0x0) {
          pQVar7 = (QRect *)&QByteArray::_empty;
        }
        cVar3 = QTest::qVerify(true,"columns >= 10 && columns <= 15",(char *)pQVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                               ,0xf5);
      }
      else {
        QString::number((int)&local_98,iVar4);
        QString::toLocal8Bit_helper((QChar *)&local_78,(longlong)local_98.ptr);
        pQVar7 = local_78.ptr;
        if (local_78.ptr == (QRect *)0x0) {
          pQVar7 = (QRect *)&QByteArray::_empty;
        }
        cVar3 = QTest::qVerify(false,"columns >= 10 && columns <= 15",(char *)pQVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                               ,0xf5);
      }
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
      if (cVar3 != '\0') {
        KDReports::Report::mainTable();
        KDReports::MainTable::pageRects();
        local_98.d = (Data *)0x0;
        local_98.ptr = (QRect *)0x0;
        local_98.size = 0;
        local_30 = (storage_type *)0x0;
        iStack_24 = 3;
        local_28 = iVar8;
        QtPrivate::QMovableArrayOps<QRect>::emplace<QRect>
                  ((QMovableArrayOps<QRect> *)&local_98,0,(QRect *)&local_30);
        local_40.y1 = 0;
        local_40.x2 = 0x13;
        local_40.y2 = 3;
        local_40.x1 = iVar4;
        QtPrivate::QMovableArrayOps<QRect>::emplace<QRect>
                  ((QMovableArrayOps<QRect> *)&local_98,local_98.size,&local_40);
        QTest::_q_compareSequence<QList<QRect>::const_iterator,QList<QRect>::const_iterator>
                  ((const_iterator)local_78.ptr,local_78.ptr + local_78.size,
                   (const_iterator)local_98.ptr,local_98.ptr + local_98.size,
                   "report.mainTable()->pageRects()",
                   "QList<QRect>() << QRect(0, 0, columns, 4) << QRect(columns, 0, totalColumns - columns, 4)"
                   ,
                   "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                   ,0xf6);
        QArrayDataPointer<QRect>::~QArrayDataPointer(&local_98);
        QArrayDataPointer<QRect>::~QArrayDataPointer(&local_78);
      }
    }
  }
  KDReports::Report::~Report(&report);
  return;
}

Assistant:

void testHorizontalScaling()
    {
        const int totalColumns = 20;
        fillModel(totalColumns, 4);
        Report report;
        report.setReportMode(Report::SpreadSheet);
        report.mainTable()->setAutoTableElement(AutoTableElement(&m_model));
        report.scaleTo(2, 1); // must fit in two pages horizontally
        report.setDefaultFont(QFont(QLatin1String(s_fontName), 48));
        QCOMPARE(report.numberOfPages(), 2);
        QVERIFY(report.mainTable()->lastAutoFontScalingFactor() < 0.9);
        // qDebug() << report.mainTable()->pageRects();
        const int columns = report.mainTable()->pageRects()[0].width();
        QVERIFY2(columns >= 10 && columns <= 15, qPrintable(QString::number(columns)));
        QCOMPARE(report.mainTable()->pageRects(), QList<QRect>() << QRect(0, 0, columns, 4) << QRect(columns, 0, totalColumns - columns, 4));
    }